

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O3

int Cudd_ReadIthClause(DdTlcInfo *tlc,int i,DdHalfWord *var1,DdHalfWord *var2,int *phase1,
                      int *phase2)

{
  DdHalfWord *pDVar1;
  long *plVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = 0;
  if ((((tlc != (DdTlcInfo *)0x0) && (pDVar1 = tlc->vars, pDVar1 != (DdHalfWord *)0x0)) &&
      (plVar2 = tlc->phases, iVar4 = 0, -1 < i && plVar2 != (long *)0x0)) &&
     (iVar4 = 0, (uint)i < tlc->cnt)) {
    *var1 = pDVar1[(uint)(i * 2)];
    uVar5 = (ulong)(i * 2 + 1);
    *var2 = pDVar1[uVar5];
    uVar3 = plVar2[(uint)i >> 5];
    *phase1 = (uint)((uVar3 >> ((ulong)(uint)(i * 2) & 0x3f) & 1) != 0);
    *phase2 = (uint)((uVar3 >> (uVar5 & 0x3f) & 1) != 0);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int
Cudd_ReadIthClause(
  DdTlcInfo * tlc,
  int i,
  DdHalfWord *var1,
  DdHalfWord *var2,
  int *phase1,
  int *phase2)
{
    if (tlc == NULL) return(0);
    if (tlc->vars == NULL || tlc->phases == NULL) return(0);
    if (i < 0 || (unsigned) i >= tlc->cnt) return(0);
    *var1 = tlc->vars[2*i];
    *var2 = tlc->vars[2*i+1];
    *phase1 = (int) bitVectorRead(tlc->phases, 2*i);
    *phase2 = (int) bitVectorRead(tlc->phases, 2*i+1);
    return(1);

}